

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O2

Var Js::JavascriptReflect::EntryDefineProperty(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  JavascriptBoolean *pJVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  int iVar7;
  undefined4 *puVar8;
  Var pvVar9;
  RecyclableObject *argument;
  RecyclableObject *pRVar10;
  PropertyRecord *pPVar11;
  int in_stack_00000010;
  undefined1 local_c0 [8];
  PropertyDescriptor propertyDescriptor;
  undefined1 local_80 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  PropertyRecord *propertyRecord;
  undefined1 auStack_40 [8];
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0xd,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00bac423;
    *puVar8 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)auStack_40,(CallInfo *)&__tag.entry.next,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pRVar10 = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_80,function,(CallInfo)__tag.entry.next,
             L"Reflect.defineProperty",&stack0x00000000);
  if ((auStack_40._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x12,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar5) goto LAB_00bac423;
    *puVar8 = 0;
  }
  if (((uint)auStack_40._0_4_ >> 0x18 & 1) != 0) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ebf5,L"Reflect.defineProperty");
  }
  if ((auStack_40._0_4_ & 0xfffffe) == 0) {
LAB_00bac40f:
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec36,L"Reflect.defineProperty");
  }
  pvVar9 = Arguments::operator[]((Arguments *)auStack_40,1);
  BVar6 = JavascriptOperators::IsObject(pvVar9);
  if (BVar6 == 0) goto LAB_00bac40f;
  pvVar9 = Arguments::operator[]((Arguments *)auStack_40,1);
  argument = pRVar10;
  if (2 < (auStack_40._0_4_ & 0xffffff)) {
    argument = (RecyclableObject *)Arguments::operator[]((Arguments *)auStack_40,2);
  }
  JavascriptConversion::ToPropertyKey
            (argument,pSVar2,(PropertyRecord **)&callInfo_local,(PropertyString **)0x0);
  if ((auStack_40._0_4_ & 0xfffffc) != 0) {
    pRVar10 = (RecyclableObject *)Arguments::operator[]((Arguments *)auStack_40,3);
  }
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_c0);
  BVar6 = JavascriptOperators::ToPropertyDescriptor(pRVar10,(PropertyDescriptor *)local_c0,pSVar2);
  if (BVar6 == 0) {
    pPVar11 = ScriptContext::GetPropertyName(pSVar2,*(PropertyId *)((long)callInfo_local + 8));
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec2c,(PCWSTR)(pPVar11 + 1));
  }
  if (pvVar9 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00bac423;
    *puVar8 = 0;
  }
  bVar5 = TaggedInt::Is(pvVar9);
  if ((ulong)pvVar9 >> 0x32 == 0 && !bVar5) {
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar9);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00bac423;
      *puVar8 = 0;
    }
    TVar1 = ((pRVar10->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) {
        pRVar10 = VarTo<Js::RecyclableObject>(pvVar9);
        propertyDescriptor.Configurable = (Type)auStack_40[0];
        propertyDescriptor.fromProxy = (Type)auStack_40[1];
        propertyDescriptor._42_2_ = auStack_40._2_2_;
        propertyDescriptor._44_4_ = auStack_40._4_4_;
        iVar7 = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])
                          (pRVar10,EntryDefineProperty,&propertyDescriptor.Configurable,0);
        goto LAB_00bac3de;
      }
    }
    else {
      BVar6 = RecyclableObject::IsExternal(pRVar10);
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar5) {
LAB_00bac423:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
      }
    }
  }
  pRVar10 = VarTo<Js::RecyclableObject>(pvVar9);
  iVar7 = JavascriptObject::DefineOwnPropertyHelper
                    (pRVar10,*(PropertyId *)((long)callInfo_local + 8),
                     (PropertyDescriptor *)local_c0,pSVar2,false);
LAB_00bac3de:
  pJVar3 = (&(((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             booleanTrue)[iVar7 == 0].ptr;
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_80);
  return pJVar3;
}

Assistant:

Var JavascriptReflect::EntryDefineProperty(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.defineProperty"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if  (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.defineProperty"));
        }

        Var propertyKey, attributes;
        if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Reflect.defineProperty"));
        }
        Var target = args[1];

        propertyKey = args.Info.Count > 2 ? args[2] : undefinedValue;
        PropertyRecord const * propertyRecord;
        JavascriptConversion::ToPropertyKey(propertyKey, scriptContext, &propertyRecord, nullptr);

        attributes = args.Info.Count > 3 ? args[3] : undefinedValue;
        PropertyDescriptor propertyDescriptor;
        if (!JavascriptOperators::ToPropertyDescriptor(attributes, &propertyDescriptor, scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propertyRecord->GetPropertyId())->GetBuffer());
        }

        // If the object is HostDispatch try to invoke the operation remotely
        BOOL defineResult;
        if (JavascriptOperators::GetTypeId(target) == TypeIds_HostDispatch)
        {
            defineResult = VarTo<RecyclableObject>(target)->InvokeBuiltInOperationRemotely(EntryDefineProperty, args, nullptr);
        }
        else
        {
            defineResult = JavascriptObject::DefineOwnPropertyHelper(VarTo<RecyclableObject>(target), propertyRecord->GetPropertyId(), propertyDescriptor, scriptContext, false);
        }

        return scriptContext->GetLibrary()->GetTrueOrFalse(defineResult);
    }